

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O3

void __thiscall soul::ASTVisitor::visit(ASTVisitor *this,TernaryOp *o)

{
  (*this->_vptr_ASTVisitor[3])(this,(o->condition).object);
  (*this->_vptr_ASTVisitor[3])(this,(o->trueBranch).object);
  (*this->_vptr_ASTVisitor[3])(this,(o->falseBranch).object);
  return;
}

Assistant:

virtual void visit (AST::TernaryOp& o)
    {
        visitObject (o.condition);
        visitObject (o.trueBranch);
        visitObject (o.falseBranch);
    }